

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O2

LRUHandle * __thiscall
leveldb::anon_unknown_0::HandleTable::Remove(HandleTable *this,Slice *key,uint32_t hash)

{
  LRUHandle *pLVar1;
  LRUHandle **ppLVar2;
  
  ppLVar2 = FindPointer(this,key,hash);
  pLVar1 = *ppLVar2;
  if (pLVar1 != (LRUHandle *)0x0) {
    *ppLVar2 = pLVar1->next_hash;
    this->elems_ = this->elems_ - 1;
  }
  return pLVar1;
}

Assistant:

LRUHandle* Remove(const Slice& key, uint32_t hash) {
    LRUHandle** ptr = FindPointer(key, hash);
    LRUHandle* result = *ptr;
    if (result != nullptr) {
      *ptr = result->next_hash;
      --elems_;
    }
    return result;
  }